

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvc.c
# Opt level: O2

int cvcMain(int argc,char **argv)

{
  octet *buf1;
  int iVar1;
  bool_t bVar2;
  err_t code;
  int iVar3;
  size_t sVar4;
  btok_cvc_t *cert;
  btok_cvc_t *pbVar5;
  cmd_pwd_t *src;
  cmd_pwd_t *dest;
  size_t *date;
  long lVar6;
  char **ppcVar7;
  uint uVar8;
  char *pcVar9;
  size_t privkey_len;
  btok_cvc_t *local_1b8;
  int readc_1;
  btok_cvc_t *local_1a8;
  int readc;
  undefined4 uStack_19c;
  size_t req_len;
  bool_t eid;
  btok_cvc_t *local_188;
  btok_cvc_t *local_180;
  int readc_2;
  size_t local_170;
  int readc_3;
  bool_t esign;
  btok_cvc_t *local_160;
  cmd_pwd_t pwd;
  cmd_pwd_t local_14b [19];
  undefined1 local_b0 [6];
  undefined1 local_aa [6];
  byte abStack_a4 [116];
  
  if (argc < 2) {
    printf("bee2cmd/%s: %s\nUsage:\n  cvc root [options] <privkeya> <certa>\n    issue self-signed certificate <certa>\n  cvc req [options] <privkey> <req>\n    generate pre-certificate <req>\n  cvc iss [options] <privkeya> <certa> <req> <cert>\n    issue <cert> based on <req> and subordinate to <certa>\n  cvc shorten [options] <privkeya> <certa> <cert>\n    shorten the lifetime of <cert> subordinate to <certa>\n  cvc val [options] <certa> <certb> ... <cert>\n    validate <certb> ... <cert> using <certa> as an anchor\n  cvc match [options] <privkey> <cert>\n    check the match between <privkey> and <cert>\n  cvc extr <cert> <pubkey>\n    extract <pubkey> from <cert>\n  cvc print [field] <cert>\n    print <cert> info: all fields or a specific field\n  .\n  <privkey>, <privkeya>\n    containers with private keys\n  <pubkey>\n    file with public key\n  options:\n    -authority <name> -- authority       [root] req\n    -holder <name> -- holder             [root] req [iss]\n    -from <YYMMDD> -- starting date      root req [iss]\n    -until <YYMMDD> -- expiration date   root req [iss] cut\n    -eid <10*hex> -- eId access mask     [root] [req] [iss]\n    -esign <4*hex> -- eSign access mask  [root] [req] [iss]\n    -pass <schema> -- password           root req iss shorten match\n    -date <YYMMDD> -- validation date    [val]\n  field:\n    {-authority|-holder|-from|-until|-eid|-esign|-pubkey|-sig}\n"
           ,"cvc","manage CV-certificates");
    return -1;
  }
  iVar3 = -1;
  iVar1 = strCmp(argv[1],"root");
  if (iVar1 == 0) {
    code = cmdStDo(8);
    if (code == 0) {
      code = cvcParseOptions((btok_cvc_t *)&pwd,(bool_t *)&req_len,&readc_2,
                             (cmd_pwd_t *)&privkey_len,(octet *)0x0,&eid,argc + -2,argv + 2);
      if (code == 0) {
        pwd = (cmd_pwd_t)privkey_len;
        if ((argc + -2) - eid != 2) goto LAB_00108db6;
        sVar4 = strLen((char *)&pwd);
        if (sVar4 == 0) {
          dest = &pwd;
          src = local_14b;
LAB_0010912a:
          strCopy((char *)dest,(char *)src);
        }
        else {
          sVar4 = strLen((char *)local_14b);
          if (sVar4 == 0) {
            src = &pwd;
            dest = local_14b;
            goto LAB_0010912a;
          }
        }
        iVar1 = strCmp((char *)&pwd,(char *)local_14b);
        if (iVar1 == 0) goto LAB_00108aee;
LAB_00109144:
        cmdPwdClose((cmd_pwd_t)privkey_len);
        code = 0x135;
      }
    }
  }
  else {
    iVar1 = strCmp(argv[1],"req");
    if (iVar1 == 0) {
      code = cmdStDo(8);
      if (code == 0) {
        code = cvcParseOptions((btok_cvc_t *)&pwd,(bool_t *)&req_len,&readc_2,
                               (cmd_pwd_t *)&privkey_len,(octet *)0x0,&eid,argc + -2,argv + 2);
        if (code == 0) {
          pwd = (cmd_pwd_t)privkey_len;
          if ((argc + -2) - eid != 2) goto LAB_00108db6;
          iVar1 = strCmp((char *)&pwd,(char *)local_14b);
          if (iVar1 == 0) goto LAB_00109144;
LAB_00108aee:
          ppcVar7 = argv + (long)eid + 2;
          code = cmdFileValExist(1,ppcVar7);
          if (code == 0) {
            code = cmdFileValNotExist(1,ppcVar7 + 1);
            if (code == 0) {
              _readc_1 = 0;
              code = cmdPrivkeyRead((octet *)0x0,(size_t *)&readc_1,*ppcVar7,(cmd_pwd_t)privkey_len)
              ;
              pwd = (cmd_pwd_t)privkey_len;
              if (code != 0) goto LAB_00109048;
              pbVar5 = (btok_cvc_t *)blobCreate(_readc_1);
              pwd = (cmd_pwd_t)privkey_len;
              if (pbVar5 == (btok_cvc_t *)0x0) {
LAB_001094d9:
                cmdPwdClose(pwd);
LAB_001094de:
                code = 0x6e;
              }
              else {
                code = cmdPrivkeyRead((octet *)pbVar5,(size_t *)0x0,*ppcVar7,(cmd_pwd_t)privkey_len)
                ;
                cmdPwdClose((cmd_pwd_t)privkey_len);
                cert = pbVar5;
                if ((code == 0) &&
                   (code = btokCVCWrap((octet *)0x0,(size_t *)&readc,(btok_cvc_t *)&pwd,
                                       (octet *)pbVar5,_readc_1), code == 0)) {
                  cert = (btok_cvc_t *)blobCreate(CONCAT44(uStack_19c,readc));
                  if (cert == (btok_cvc_t *)0x0) {
LAB_00109578:
                    blobClose(pbVar5);
                    goto LAB_001094de;
                  }
                  code = btokCVCWrap((octet *)cert,(size_t *)0x0,(btok_cvc_t *)&pwd,(octet *)pbVar5,
                                     _readc_1);
                  blobClose(pbVar5);
                  if (code == 0) {
                    code = cmdFileWrite(ppcVar7[1],cert,CONCAT44(uStack_19c,readc));
                  }
                }
LAB_00109532:
                blobClose(cert);
              }
            }
          }
        }
      }
    }
    else {
      iVar1 = strCmp(argv[1],"iss");
      if (iVar1 == 0) {
        code = cmdStDo(8);
        if (code == 0) {
          code = cvcParseOptions((btok_cvc_t *)&pwd,&eid,&esign,(cmd_pwd_t *)&privkey_len,
                                 (octet *)0x0,&readc_3,argc + -2,argv + 2);
          if (code == 0) {
            sVar4 = strLen((char *)&pwd);
            pwd = (cmd_pwd_t)privkey_len;
            if ((sVar4 != 0) || ((argc + -2) - readc_3 != 4)) goto LAB_00108db6;
            ppcVar7 = argv + 2 + readc_3;
            code = cmdFileValExist(3,ppcVar7);
            if (code != 0) goto LAB_00109181;
            code = cmdFileValNotExist(1,ppcVar7 + 3);
            if (code != 0) goto LAB_00109181;
            _readc_1 = 0;
            code = cmdPrivkeyRead((octet *)0x0,(size_t *)&readc_1,*ppcVar7,(cmd_pwd_t)privkey_len);
            pwd = (cmd_pwd_t)privkey_len;
            if (code == 0) {
              pbVar5 = (btok_cvc_t *)blobCreate(_readc_1);
              pwd = (cmd_pwd_t)privkey_len;
              if (pbVar5 != (btok_cvc_t *)0x0) {
                code = cmdPrivkeyRead((octet *)pbVar5,(size_t *)0x0,*ppcVar7,(cmd_pwd_t)privkey_len)
                ;
                cmdPwdClose((cmd_pwd_t)privkey_len);
                cert = pbVar5;
                if (((code == 0) &&
                    (code = cmdFileReadAll((void *)0x0,(size_t *)&readc,ppcVar7[1]), code == 0)) &&
                   (code = cmdFileReadAll((void *)0x0,&req_len,ppcVar7[2]), code == 0)) {
                  local_1a8 = (btok_cvc_t *)(req_len + 0x30);
                  local_188 = (btok_cvc_t *)req_len;
                  _readc_2 = local_1a8;
                  local_1b8 = (btok_cvc_t *)
                              blobCreate(CONCAT44(uStack_19c,readc) + req_len * 2 + 0x158);
                  if (local_1b8 != (btok_cvc_t *)0x0) {
                    local_180 = (btok_cvc_t *)CONCAT44(uStack_19c,readc);
                    local_170 = req_len;
                    code = cmdFileReadAll(local_1b8,(size_t *)&readc,ppcVar7[1]);
                    if (code == 0) {
                      pcVar9 = local_180->authority + (long)local_1b8->authority;
                      code = cmdFileReadAll(pcVar9,&req_len,ppcVar7[2]);
                      if (code == 0) {
                        local_160 = (btok_cvc_t *)(pcVar9 + local_170);
                        local_1a8 = (btok_cvc_t *)
                                    (local_160->authority + (long)local_1a8->authority);
                        code = btokCVCUnwrap(local_1a8,(octet *)pcVar9,req_len,local_1a8->pubkey,0);
                        if (code == 0) {
                          sVar4 = strLen((char *)local_14b);
                          if (sVar4 != 0) {
                            strCopy(local_1a8->holder,(char *)local_14b);
                          }
                          bVar2 = memIsZero(local_b0,6);
                          if (bVar2 == 0) {
                            memCopy(local_1a8->from,local_b0,6);
                          }
                          bVar2 = memIsZero(local_aa,6);
                          if (bVar2 == 0) {
                            memCopy(local_1a8->until,local_aa,6);
                          }
                          if (eid != 0) {
                            for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
                              (local_180->authority + (long)(local_188->authority + local_170) +
                              (long)local_1b8)[lVar6 + 0xe4] =
                                   (local_180->authority + (long)(local_188->authority + local_170)
                                   + (long)local_1b8)[lVar6 + 0xe4] & abStack_a4[lVar6];
                            }
                          }
                          if (esign != 0) {
                            for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
                              (local_188->authority + (long)(local_180->authority + local_170))
                              [(long)(local_1b8->authority + lVar6 + 0xe9)] =
                                   (local_188->authority + (long)(local_180->authority + local_170))
                                   [(long)(local_1b8->authority + lVar6 + 0xe9)] &
                                   abStack_a4[lVar6 + 5];
                            }
                          }
                          code = btokCVCIss((octet *)local_160,(size_t *)&readc_2,local_1a8,
                                            (octet *)local_1b8,CONCAT44(uStack_19c,readc),
                                            (octet *)pbVar5,_readc_1);
                          blobClose(pbVar5);
                          cert = local_1b8;
                          if (code == 0) {
                            pcVar9 = ppcVar7[3];
                            req_len = (size_t)_readc_2;
                            pbVar5 = local_160;
LAB_001096f1:
                            code = cmdFileWrite(pcVar9,pbVar5,req_len);
                            cert = local_1b8;
                          }
                          goto LAB_00109532;
                        }
                      }
                    }
LAB_00108d3d:
                    blobClose(pbVar5);
                    cert = local_1b8;
                    goto LAB_00109532;
                  }
                  goto LAB_00109578;
                }
                goto LAB_00109532;
              }
              goto LAB_001094d9;
            }
LAB_00109048:
            cmdPwdClose(pwd);
          }
        }
      }
      else {
        iVar1 = strCmp(argv[1],"shorten");
        if (iVar1 == 0) {
          code = cmdStDo(8);
          if (code == 0) {
            code = cvcParseOptions((btok_cvc_t *)&pwd,(bool_t *)0x0,(bool_t *)0x0,
                                   (cmd_pwd_t *)&privkey_len,(octet *)0x0,&readc_2,argc + -2,
                                   argv + 2);
            if (code == 0) {
              sVar4 = strLen((char *)&pwd);
              pwd = (cmd_pwd_t)privkey_len;
              if (((sVar4 == 0) &&
                  (sVar4 = strLen((char *)local_14b), pwd = (cmd_pwd_t)privkey_len, sVar4 == 0)) &&
                 (bVar2 = memIsZero(local_b0,6), pwd = (cmd_pwd_t)privkey_len, bVar2 != 0)) {
                bVar2 = memIsZero(local_aa,6);
                pwd = (cmd_pwd_t)privkey_len;
                if (bVar2 == 0) {
                  if ((argc + -2) - readc_2 == 3) {
                    ppcVar7 = argv + 2 + readc_2;
                    code = cmdFileValExist(3,ppcVar7);
                    if (code == 0) {
                      _readc_1 = 0;
                      code = cmdPrivkeyRead((octet *)0x0,(size_t *)&readc_1,*ppcVar7,
                                            (cmd_pwd_t)privkey_len);
                      pwd = (cmd_pwd_t)privkey_len;
                      if (code != 0) goto LAB_00109048;
                      pbVar5 = (btok_cvc_t *)blobCreate(_readc_1);
                      pwd = (cmd_pwd_t)privkey_len;
                      if (pbVar5 == (btok_cvc_t *)0x0) goto LAB_001094d9;
                      code = cmdPrivkeyRead((octet *)pbVar5,(size_t *)0x0,*ppcVar7,
                                            (cmd_pwd_t)privkey_len);
                      cmdPwdClose((cmd_pwd_t)privkey_len);
                      cert = pbVar5;
                      if (((code == 0) &&
                          (code = cmdFileReadAll((void *)0x0,(size_t *)&readc,ppcVar7[1]), code == 0
                          )) && (code = cmdFileReadAll((void *)0x0,&req_len,ppcVar7[2]), code == 0))
                      {
                        local_1b8 = (btok_cvc_t *)
                                    blobCreate(CONCAT44(uStack_19c,readc) + req_len + 0x128);
                        if (local_1b8 == (btok_cvc_t *)0x0) goto LAB_00109578;
                        local_1a8 = (btok_cvc_t *)
                                    (local_1b8->authority + CONCAT44(uStack_19c,readc));
                        local_188 = (btok_cvc_t *)(local_1a8->authority + req_len);
                        code = cmdFileReadAll(local_1b8,(size_t *)&readc,ppcVar7[1]);
                        if ((((code != 0) ||
                             (code = cmdFileReadAll(local_1a8,&req_len,ppcVar7[2]), code != 0)) ||
                            (code = btokCVCVal((octet *)local_1a8,req_len,(octet *)local_1b8,
                                               CONCAT44(uStack_19c,readc),(octet *)0x0), code != 0))
                           || (code = btokCVCUnwrap(local_188,(octet *)local_1a8,req_len,
                                                    (octet *)0x0,0), code != 0)) goto LAB_00108d3d;
                        buf1 = local_188->until;
                        iVar1 = memCmp(buf1,local_aa,6);
                        if (iVar1 < 0) {
                          blobClose(pbVar5);
                          blobClose(local_1b8);
                          code = 0x134;
                          goto LAB_00109181;
                        }
                        memCopy(buf1,local_aa,6);
                        code = btokCVCIss((octet *)local_1a8,(size_t *)0x0,local_188,
                                          (octet *)local_1b8,CONCAT44(uStack_19c,readc),
                                          (octet *)pbVar5,_readc_1);
                        blobClose(pbVar5);
                        cert = local_1b8;
                        if (code == 0) {
                          pcVar9 = ppcVar7[2];
                          pbVar5 = local_1a8;
                          goto LAB_001096f1;
                        }
                      }
                      goto LAB_00109532;
                    }
                    goto LAB_00109181;
                  }
                }
              }
LAB_00108db6:
              cmdPwdClose(pwd);
              code = 0x25b;
            }
          }
        }
        else {
          iVar1 = strCmp(argv[1],"val");
          if (iVar1 == 0) {
            code = cmdStDo(8);
            if (code == 0) {
              code = cvcParseOptions((btok_cvc_t *)0x0,(bool_t *)0x0,(bool_t *)0x0,(cmd_pwd_t *)0x0,
                                     (octet *)&privkey_len,&readc_1,argc + -2,argv + 2);
              if (code != 0) goto LAB_00109181;
              pbVar5 = (btok_cvc_t *)(long)readc_1;
              iVar1 = (argc + -2) - readc_1;
              code = 0x25b;
              if (iVar1 < 2) goto LAB_00109181;
              ppcVar7 = argv + 2 + (long)pbVar5;
              code = cmdFileValExist(iVar1,ppcVar7);
              if (code != 0) goto LAB_00109181;
              local_1b8 = pbVar5;
              cert = (btok_cvc_t *)blobCreate(0x450);
              if (cert != (btok_cvc_t *)0x0) {
                code = cmdFileReadAll((void *)0x0,(size_t *)&pwd,*ppcVar7);
                if (code == 0) {
                  if (pwd < (cmd_pwd_t)0x201) {
                    code = cmdFileReadAll(cert,(size_t *)&pwd,*ppcVar7);
                    if (code == 0) {
                      local_1a8 = (btok_cvc_t *)(cert[1].sig + 0x1d);
                      code = btokCVCUnwrap(local_1a8,(octet *)cert,(size_t)pwd,(octet *)0x0,0);
                      if (code == 0) {
                        local_180 = (btok_cvc_t *)(cert[2].sig + 0x1d);
                        local_188 = (btok_cvc_t *)(argv + (long)(local_1b8->authority + 3));
                        uVar8 = argc - (int)local_1b8;
                        local_1b8 = (btok_cvc_t *)((ulong)uVar8 - 3);
                        lVar6 = 0;
                        while( true ) {
                          if ((int)local_1b8 == (int)lVar6) break;
                          code = cmdFileReadAll((void *)0x0,(size_t *)&pwd,
                                                *(char **)(local_188->authority + lVar6 * 8));
                          if (code != 0) goto LAB_00109532;
                          if ((cmd_pwd_t)0x200 < pwd) goto LAB_001094cd;
                          code = cmdFileReadAll(cert,(size_t *)&pwd,
                                                *(char **)(local_188->authority + lVar6 * 8));
                          if (code != 0) goto LAB_00109532;
                          if ((uVar8 - 4 == (int)lVar6) &&
                             (bVar2 = memIsZero(&privkey_len,6), bVar2 == 0)) {
                            date = &privkey_len;
                          }
                          else {
                            date = (size_t *)0x0;
                          }
                          code = btokCVCVal2(local_180,(octet *)cert,(size_t)pwd,local_1a8,
                                             (octet *)date);
                          if (code != 0) goto LAB_00109532;
                          memCopy(local_1a8,local_180,0x128);
                          lVar6 = lVar6 + 1;
                        }
                        code = 0;
                      }
                    }
                  }
                  else {
LAB_001094cd:
                    code = 0x202;
                  }
                }
                goto LAB_00109532;
              }
              goto LAB_001094de;
            }
          }
          else {
            iVar1 = strCmp(argv[1],"match");
            if (iVar1 == 0) {
              code = cmdStDo(8);
              if (code == 0) {
                code = cvcParseOptions((btok_cvc_t *)0x0,(bool_t *)0x0,(bool_t *)0x0,&pwd,
                                       (octet *)0x0,&readc,argc + -2,argv + 2);
                if (code == 0) {
                  if ((argc + -2) - readc != 2) goto LAB_00108db6;
                  ppcVar7 = argv + 2 + readc;
                  code = cmdFileValExist(2,ppcVar7);
                  if (code == 0) {
                    privkey_len = 0;
                    code = cmdPrivkeyRead((octet *)0x0,&privkey_len,*ppcVar7,pwd);
                    if (code != 0) goto LAB_00109048;
                    pbVar5 = (btok_cvc_t *)blobCreate(privkey_len);
                    if (pbVar5 == (btok_cvc_t *)0x0) goto LAB_001094d9;
                    code = cmdPrivkeyRead((octet *)pbVar5,(size_t *)0x0,*ppcVar7,pwd);
                    cmdPwdClose(pwd);
                    cert = pbVar5;
                    if ((code == 0) &&
                       (code = cmdFileReadAll((void *)0x0,(size_t *)&readc_1,ppcVar7[1]), code == 0)
                       ) {
                      cert = (btok_cvc_t *)blobCreate(_readc_1);
                      if (cert == (btok_cvc_t *)0x0) goto LAB_00109578;
                      code = cmdFileReadAll(cert,(size_t *)&readc_1,ppcVar7[1]);
                      if (code == 0) {
                        code = btokCVCMatch((octet *)cert,_readc_1,(octet *)pbVar5,privkey_len);
                        blobClose(cert);
                        cert = pbVar5;
                      }
                      else {
                        blobClose(pbVar5);
                      }
                    }
                    goto LAB_00109532;
                  }
                }
              }
            }
            else {
              iVar1 = strCmp(argv[1],"extr");
              if (iVar1 == 0) {
                code = 0x25b;
                if (argc == 4) {
                  ppcVar7 = argv + 2;
                  code = cmdFileValExist(1,ppcVar7);
                  if (code == 0) {
                    code = cmdFileValNotExist(1,argv + 3);
                    if ((code == 0) &&
                       (code = cmdFileReadAll((void *)0x0,(size_t *)&pwd,*ppcVar7), code == 0)) {
                      cert = (btok_cvc_t *)blobCreate((size_t)(pwd + 0x128));
                      if (cert == (btok_cvc_t *)0x0) goto LAB_001094de;
                      local_1b8 = (btok_cvc_t *)(pwd + (long)cert);
                      code = cmdFileReadAll(cert,(size_t *)&pwd,*ppcVar7);
                      if ((code == 0) &&
                         (code = btokCVCUnwrap(local_1b8,(octet *)cert,(size_t)pwd,(octet *)0x0,0),
                         code == 0)) {
                        code = cmdFileWrite(argv[3],local_1b8->pubkey,local_1b8->pubkey_len);
                      }
                      goto LAB_00109532;
                    }
                  }
                }
              }
              else {
                iVar1 = strCmp(argv[1],"print");
                code = 0x259;
                if (iVar1 != 0) goto LAB_00109185;
                code = 0x25b;
                if (0xfffffffd < argc - 5U) {
                  ppcVar7 = argv + 2;
                  if (argc == 4) {
                    pcVar9 = *ppcVar7;
                    sVar4 = strLen(pcVar9);
                    if ((sVar4 == 0) || (*pcVar9 != '-')) goto LAB_00109181;
                    pcVar9 = pcVar9 + 1;
                    ppcVar7 = argv + 3;
                  }
                  else {
                    pcVar9 = (char *)0x0;
                  }
                  code = cmdFileValExist(1,ppcVar7);
                  if ((code == 0) &&
                     (code = cmdFileReadAll((void *)0x0,(size_t *)&pwd,*ppcVar7), code == 0)) {
                    cert = (btok_cvc_t *)blobCreate((size_t)(pwd + 0x128));
                    if (cert != (btok_cvc_t *)0x0) {
                      local_1b8 = (btok_cvc_t *)(pwd + (long)cert);
                      code = cmdFileReadAll(cert,(size_t *)&pwd,*ppcVar7);
                      if ((code == 0) &&
                         (code = btokCVCUnwrap(local_1b8,(octet *)cert,(size_t)pwd,(octet *)0x0,0),
                         code == 0)) {
                        code = cmdCVCPrint(local_1b8,pcVar9);
                      }
                      goto LAB_00109532;
                    }
                    goto LAB_001094de;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00109181:
  if (code == 0) {
    iVar3 = strCmp(argv[1],"val");
    if (iVar3 == 0) {
      iVar3 = 0;
      code = 0;
    }
    else {
      iVar1 = strCmp(argv[1],"match");
      iVar3 = 0;
      code = 0;
      if (iVar1 != 0) {
        return 0;
      }
    }
  }
LAB_00109185:
  pcVar9 = errMsg(code);
  printf("bee2cmd/%s: %s\n","cvc",pcVar9);
  return iVar3;
}

Assistant:

int cvcMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return cvcUsage();
	// разбор команды
	++argv, --argc;
	if (strEq(argv[0], "root"))
		code = cvcRoot(argc - 1, argv + 1);
	else if (strEq(argv[0], "req"))
		code = cvcReq(argc - 1, argv + 1);
	else if (strEq(argv[0], "iss"))
		code = cvcIss(argc - 1, argv + 1);
	else if (strEq(argv[0], "shorten"))
		code = cvcShorten(argc - 1, argv + 1);
	else if (strEq(argv[0], "val"))
		code = cvcVal(argc - 1, argv + 1);
	else if (strEq(argv[0], "match"))
		code = cvcMatch(argc - 1, argv + 1);
	else if (strEq(argv[0], "extr"))
		code = cvcExtr(argc - 1, argv + 1);
	else if (strEq(argv[0], "print"))
		code = cvcPrint(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK || strEq(argv[0], "val") || strEq(argv[0], "match"))
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}